

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O2

Loop * __thiscall spvtools::opt::LoopFissionImpl::SplitLoop(LoopFissionImpl *this)

{
  Instruction *pIVar1;
  size_type sVar2;
  pointer ppIVar3;
  Function *this_00;
  uint32_t uVar4;
  uint32_t uVar5;
  Loop *this_01;
  BasicBlock *pBVar6;
  __node_base *p_Var7;
  CFG *pCVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  IRContext *pIVar11;
  mapped_type *ppIVar12;
  Instruction *inst_1;
  Instruction *inst;
  pointer ppIVar13;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *this_02;
  iterator iVar14;
  Instruction *old_inst;
  LoopUtils util;
  LoopCloningResult clone_results;
  Instruction *local_198;
  IRContext *local_190;
  Instruction *local_188;
  Loop *local_180;
  __node_base *local_178;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_170;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  local_168;
  LoopUtils local_148;
  undefined1 local_128 [224];
  move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>_>
  local_48;
  move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>_>
  local_40;
  
  LoopUtils::LoopUtils(&local_148,this->context_,this->loop_);
  LoopUtils::LoopCloningResult::LoopCloningResult((LoopCloningResult *)local_128);
  this_01 = LoopUtils::CloneAndAttachLoopToHeader(&local_148,(LoopCloningResult *)local_128);
  Loop::UpdateLoopMergeInst(this_01);
  this_00 = local_148.function_;
  pBVar6 = Loop::GetOrCreatePreHeaderBlock(this->loop_);
  uVar4 = BasicBlock::id(pBVar6);
  iVar14 = opt::Function::FindBlock(this_00,uVar4);
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
  ::
  insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>>,void>
            ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
              *)&(local_148.function_)->blocks_,iVar14.iterator_._M_current._M_current + 1,local_48,
             local_40);
  local_180 = this_01;
  Loop::SetPreHeaderBlock(this->loop_,this_01->loop_merge_);
  local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_02 = &this->original_loop_instructions_;
  p_Var7 = &(this->loop_->loop_basic_blocks_)._M_h._M_before_begin;
  local_170 = this_02;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    sVar2 = *(size_type *)(p_Var7 + 1);
    local_178 = p_Var7;
    pCVar8 = IRContext::cfg(this->context_);
    pBVar6 = CFG::block(pCVar8,(uint32_t)sVar2);
    pIVar1 = &(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    while (pIVar1 = *(Instruction **)
                     ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
          p_Var7 = local_178,
          pIVar1 != &(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      local_198 = pIVar1;
      sVar9 = std::
              set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              ::count(&this->cloned_loop_instructions_,&local_198);
      if (((sVar9 == 1) &&
          (local_188 = pIVar1,
          sVar9 = std::
                  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                  ::count(this_02,&local_188), sVar9 == 0)) &&
         (local_198 = pIVar1,
         std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
         emplace_back<spvtools::opt::Instruction*>
                   ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                     *)&local_168,&local_198), pIVar1->opcode_ == OpPhi)) {
        local_190 = this->context_;
        uVar4 = Instruction::result_id(pIVar1);
        uVar5 = Instruction::result_id(pIVar1);
        local_198 = (Instruction *)CONCAT44(local_198._4_4_,uVar5);
        pmVar10 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)(local_128 + 0x38),(key_type *)&local_198);
        this_02 = local_170;
        IRContext::ReplaceAllUsesWith(local_190,uVar4,*pmVar10);
      }
    }
  }
  pIVar11 = (IRContext *)&(local_180->loop_basic_blocks_)._M_h._M_before_begin;
  while (ppIVar3 = local_168._M_impl.super__Vector_impl_data._M_finish,
        pIVar11 = (IRContext *)pIVar11->syntax_context_,
        ppIVar13 = local_168._M_impl.super__Vector_impl_data._M_start, pIVar11 != (IRContext *)0x0)
  {
    uVar4 = (pIVar11->grammar_).target_env_;
    local_190 = pIVar11;
    pCVar8 = IRContext::cfg(this->context_);
    pBVar6 = CFG::block(pCVar8,uVar4);
    pIVar1 = &(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    while (pIVar1 = *(Instruction **)
                     ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
          pIVar11 = local_190,
          pIVar1 != &(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      local_198 = pIVar1;
      ppIVar12 = std::__detail::
                 _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)local_128,&local_198);
      local_198 = *ppIVar12;
      sVar9 = std::
              set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              ::count(&this->cloned_loop_instructions_,&local_198);
      if ((sVar9 == 0) &&
         (sVar9 = std::
                  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                  ::count(this_02,&local_198), sVar9 == 1)) {
        local_188 = pIVar1;
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&local_168,&local_188);
      }
    }
  }
  for (; ppIVar13 != ppIVar3; ppIVar13 = ppIVar13 + 1) {
    IRContext::KillInst(this->context_,*ppIVar13);
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_168);
  LoopUtils::LoopCloningResult::~LoopCloningResult((LoopCloningResult *)local_128);
  return local_180;
}

Assistant:

Loop* LoopFissionImpl::SplitLoop() {
  // Clone the loop.
  LoopUtils util{context_, loop_};
  LoopUtils::LoopCloningResult clone_results;
  Loop* cloned_loop = util.CloneAndAttachLoopToHeader(&clone_results);

  // Update the OpLoopMerge in the cloned loop.
  cloned_loop->UpdateLoopMergeInst();

  // Add the loop_ to the module.
  // TODO(1841): Handle failure to create pre-header.
  Function::iterator it =
      util.GetFunction()->FindBlock(loop_->GetOrCreatePreHeaderBlock()->id());
  util.GetFunction()->AddBasicBlocks(clone_results.cloned_bb_.begin(),
                                     clone_results.cloned_bb_.end(), ++it);
  loop_->SetPreHeaderBlock(cloned_loop->GetMergeBlock());

  std::vector<Instruction*> instructions_to_kill{};

  // Kill all the instructions which should appear in the cloned loop but not in
  // the original loop.
  for (uint32_t id : loop_->GetBlocks()) {
    BasicBlock* block = context_->cfg()->block(id);

    for (Instruction& inst : *block) {
      // If the instruction appears in the cloned loop instruction group, kill
      // it.
      if (cloned_loop_instructions_.count(&inst) == 1 &&
          original_loop_instructions_.count(&inst) == 0) {
        instructions_to_kill.push_back(&inst);
        if (inst.opcode() == spv::Op::OpPhi) {
          context_->ReplaceAllUsesWith(
              inst.result_id(), clone_results.value_map_[inst.result_id()]);
        }
      }
    }
  }

  // Kill all instructions which should appear in the original loop and not in
  // the cloned loop.
  for (uint32_t id : cloned_loop->GetBlocks()) {
    BasicBlock* block = context_->cfg()->block(id);
    for (Instruction& inst : *block) {
      Instruction* old_inst = clone_results.ptr_map_[&inst];
      // If the instruction belongs to the original loop instruction group, kill
      // it.
      if (cloned_loop_instructions_.count(old_inst) == 0 &&
          original_loop_instructions_.count(old_inst) == 1) {
        instructions_to_kill.push_back(&inst);
      }
    }
  }

  for (Instruction* i : instructions_to_kill) {
    context_->KillInst(i);
  }

  return cloned_loop;
}